

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

bool __thiscall leveldb::Compaction::ShouldStopBefore(Compaction *this,Slice *internal_key)

{
  InternalKeyComparator *pIVar1;
  VersionSet *pVVar2;
  pointer ppFVar3;
  FileMetaData *pFVar4;
  long lVar5;
  size_t sVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  uVar8 = this->grandparent_index_;
  pVVar2 = this->input_version_->vset_;
  pIVar1 = &pVVar2->icmp_;
  while (ppFVar3 = (this->grandparents_).
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,
        uVar8 < (ulong)((long)(this->grandparents_).
                              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar3 >> 3)) {
    pFVar4 = ppFVar3[uVar8];
    local_38 = *(undefined4 *)&(pFVar4->largest).rep_._M_dataplus._M_p;
    uStack_34 = *(undefined4 *)((long)&(pFVar4->largest).rep_._M_dataplus._M_p + 4);
    uStack_30 = (undefined4)(pFVar4->largest).rep_._M_string_length;
    uStack_2c = *(undefined4 *)((long)&(pFVar4->largest).rep_._M_string_length + 4);
    iVar7 = (*(pIVar1->super_Comparator)._vptr_Comparator[2])(pIVar1,internal_key,&local_38);
    if (iVar7 < 1) break;
    if (this->seen_key_ == true) {
      this->overlapped_bytes_ =
           this->overlapped_bytes_ +
           (this->grandparents_).
           super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
           _M_impl.super__Vector_impl_data._M_start[this->grandparent_index_]->file_size;
    }
    uVar8 = this->grandparent_index_ + 1;
    this->grandparent_index_ = uVar8;
  }
  this->seen_key_ = true;
  lVar5 = this->overlapped_bytes_;
  sVar6 = pVVar2->options_->max_file_size;
  lVar9 = sVar6 * 10;
  if (lVar5 != lVar9 && SBORROW8(lVar5,lVar9) == (long)(lVar5 + sVar6 * -10) < 0) {
    this->overlapped_bytes_ = 0;
  }
  return lVar5 != lVar9 && SBORROW8(lVar5,lVar9) == (long)(lVar5 + sVar6 * -10) < 0;
}

Assistant:

bool Compaction::ShouldStopBefore(const Slice& internal_key) {
  const VersionSet* vset = input_version_->vset_;
  // Scan to find earliest grandparent file that contains key.
  const InternalKeyComparator* icmp = &vset->icmp_;
  while (grandparent_index_ < grandparents_.size() &&
         icmp->Compare(internal_key,
                       grandparents_[grandparent_index_]->largest.Encode()) >
             0) {
    if (seen_key_) {
      overlapped_bytes_ += grandparents_[grandparent_index_]->file_size;
    }
    grandparent_index_++;
  }
  seen_key_ = true;

  if (overlapped_bytes_ > MaxGrandParentOverlapBytes(vset->options_)) {
    // Too much overlap for current output; start new output
    overlapped_bytes_ = 0;
    return true;
  } else {
    return false;
  }
}